

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

iterator __thiscall
ft::vector<int,_ft::allocator<int>_>::erase
          (vector<int,_ft::allocator<int>_> *this,iterator first,iterator last)

{
  size_type sVar1;
  iterator piVar2;
  value_type_conflict *val;
  value_type_conflict *local_48;
  vector<int,_ft::allocator<int>_> tmp;
  
  vector<int,ft::allocator<int>>::vector<int*>
            ((vector<int,ft::allocator<int>> *)&local_48,last,this->m_data + this->m_size,
             (allocator_type *)&tmp.field_0x1f,(type *)0x0);
  sVar1 = this->m_size;
  for (piVar2 = this->m_data + sVar1; sVar1 = sVar1 - 1, val = local_48, piVar2 != first;
      piVar2 = piVar2 + -1) {
    this->m_size = sVar1;
  }
  for (; val != local_48 + (long)tmp.m_data; val = val + 1) {
    push_back(this,val);
  }
  operator_delete(local_48);
  return first;
}

Assistant:

iterator    erase(iterator first, iterator last) {
		vector	tmp(last, this->end());
		while (first != this->end())
			this->pop_back();
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
		return first;
	}